

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O0

int SHA512FinalBits(SHA512Context *context,uint8_t message_bits,uint length)

{
  uint in_EDX;
  uint8_t in_SIL;
  SHA512Context *in_RDI;
  int local_4;
  
  if (in_RDI == (SHA512Context *)0x0) {
    local_4 = 1;
  }
  else if (in_EDX == 0) {
    local_4 = 0;
  }
  else if (in_RDI->Corrupted == 0) {
    if (in_RDI->Computed == 0) {
      if (in_EDX < 8) {
        SHA384_512AddLength(in_RDI,in_EDX);
        SHA384_512Finalize(in_RDI,in_SIL);
        local_4 = in_RDI->Corrupted;
      }
      else {
        in_RDI->Corrupted = 4;
        local_4 = 4;
      }
    }
    else {
      in_RDI->Corrupted = 3;
      local_4 = 3;
    }
  }
  else {
    local_4 = in_RDI->Corrupted;
  }
  return local_4;
}

Assistant:

int SHA512FinalBits(SHA512Context *context,
                    uint8_t message_bits, unsigned int length)
{
  static uint8_t masks[8] = {
      /* 0 0b00000000 */ 0x00, /* 1 0b10000000 */ 0x80,
      /* 2 0b11000000 */ 0xC0, /* 3 0b11100000 */ 0xE0,
      /* 4 0b11110000 */ 0xF0, /* 5 0b11111000 */ 0xF8,
      /* 6 0b11111100 */ 0xFC, /* 7 0b11111110 */ 0xFE
  };
  static uint8_t markbit[8] = {
      /* 0 0b10000000 */ 0x80, /* 1 0b01000000 */ 0x40,
      /* 2 0b00100000 */ 0x20, /* 3 0b00010000 */ 0x10,
      /* 4 0b00001000 */ 0x08, /* 5 0b00000100 */ 0x04,
      /* 6 0b00000010 */ 0x02, /* 7 0b00000001 */ 0x01
  };

  if (!context) return shaNull;
  if (!length) return shaSuccess;
  if (context->Corrupted) return context->Corrupted;
  if (context->Computed) return context->Corrupted = shaStateError;
  if (length >= 8) return context->Corrupted = shaBadParam;

  SHA384_512AddLength(context, length);
  SHA384_512Finalize(context, (uint8_t)
    ((message_bits & masks[length]) | markbit[length]));

  return context->Corrupted;
}